

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_core_linux.c
# Opt level: O0

int os_core_linux_get_random(void *dst,size_t length)

{
  int __fd;
  ssize_t sVar1;
  void *local_38;
  uint8_t *u8ptr;
  ssize_t result;
  size_t sStack_20;
  int random_fd;
  size_t length_local;
  void *dst_local;
  
  __fd = open("/dev/urandom",0);
  local_38 = dst;
  sStack_20 = length;
  if (__fd == -1) {
    dst_local._4_4_ = -1;
  }
  else {
    for (; sStack_20 != 0; sStack_20 = sStack_20 - sVar1) {
      sVar1 = read(__fd,local_38,sStack_20);
      if (sVar1 < 0) {
        close(__fd);
        return -1;
      }
      local_38 = (void *)(sVar1 + (long)local_38);
    }
    close(__fd);
    dst_local._4_4_ = 0;
  }
  return dst_local._4_4_;
}

Assistant:

int
os_core_linux_get_random(void *dst, size_t length) {
  int random_fd;
  ssize_t result;
  uint8_t *u8ptr;

  u8ptr = dst;

  /* open urandom */
  random_fd = open("/dev/urandom", O_RDONLY);
  if (random_fd == -1) {
    return -1;
  }

  while (length > 0) {
    result = read(random_fd, u8ptr, length);
    if (result < 0) {
      close(random_fd);
      return -1;
    }

    u8ptr += result;
    length -= result;
  }
  close(random_fd);
  return 0;
}